

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith_uint256_tests.cpp
# Opt level: O1

void __thiscall arith_uint256_tests::shifts::test_method(shifts *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  uint uVar4;
  base_uint<256U> *pbVar5;
  uint uVar6;
  undefined8 in_RCX;
  ptrdiff_t _Num;
  uint uVar7;
  iterator in_R8;
  iterator pvVar8;
  iterator in_R9;
  iterator pvVar9;
  uint i;
  long in_FS_OFFSET;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  arith_uint256 c2L;
  arith_uint256 TmpL;
  uchar TmpArray [32];
  check_type cVar38;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  assertion_result local_390;
  undefined1 *local_378;
  undefined1 *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  char *local_350;
  undefined1 *local_348;
  undefined1 *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  char *local_320;
  undefined1 *local_318;
  undefined1 *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  char *local_2f0;
  undefined1 *local_2e8;
  undefined1 *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  undefined1 *local_1f8;
  undefined1 *local_1f0;
  char *local_1e8;
  char *local_1e0;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  shared_ptr<boost::basic_wrap_stringstream<char>_> sStack_110;
  char cStack_100;
  char cStack_ff;
  char cStack_fe;
  char cStack_fd;
  char cStack_fc;
  char cStack_fb;
  char cStack_fa;
  char cStack_f9;
  assertion_result local_f8;
  char cStack_e0;
  char cStack_df;
  char cStack_de;
  char cStack_dd;
  char cStack_dc;
  char cStack_db;
  char cStack_da;
  char cStack_d9;
  undefined1 local_d8 [16];
  long local_c8 [2];
  arith_uint256 local_b8;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  uchar local_78 [32];
  undefined1 local_58 [8];
  undefined1 auStack_50 [16];
  assertion_result *paStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  uVar4 = 0xff;
  uVar7 = 0;
  while( true ) {
    shiftArrayLeft(local_78,OneArray,uVar7,(uint)in_RCX);
    local_128 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_120 = "";
    local_138 = &boost::unit_test::basic_cstring<char_const>::null;
    local_130 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xa7;
    file.m_begin = (iterator)&local_128;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_138,msg);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_78,local_58,
               (allocator_type *)&local_3a0);
    if (local_d8._8_8_ - local_d8._0_8_ != 0x20) break;
    memmove((lazy_ostream *)local_58,(void *)local_d8._0_8_,0x20);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013ea794;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013ea78c;
    auStack_50._0_8_ = uRam00000000013ea784;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
    local_f8.m_message.px._0_1_ = (char)pbVar5->pn[2];
    local_f8.m_message.px._1_1_ = *(char *)((long)pbVar5->pn + 9);
    local_f8.m_message.px._2_1_ = *(char *)((long)pbVar5->pn + 10);
    local_f8.m_message.px._3_1_ = *(char *)((long)pbVar5->pn + 0xb);
    local_f8.m_message.px._4_1_ = (char)pbVar5->pn[3];
    local_f8.m_message.px._5_1_ = *(char *)((long)pbVar5->pn + 0xd);
    local_f8.m_message.px._6_1_ = *(char *)((long)pbVar5->pn + 0xe);
    local_f8.m_message.px._7_1_ = *(char *)((long)pbVar5->pn + 0xf);
    auVar10 = *(undefined1 (*) [16])(pbVar5->pn + 4);
    local_f8.m_message.pn.pi_._0_1_ = auVar10[0];
    local_f8.m_message.pn.pi_._1_1_ = auVar10[1];
    local_f8.m_message.pn.pi_._2_1_ = auVar10[2];
    local_f8.m_message.pn.pi_._3_1_ = auVar10[3];
    local_f8.m_message.pn.pi_._4_1_ = auVar10[4];
    local_f8.m_message.pn.pi_._5_1_ = auVar10[5];
    local_f8.m_message.pn.pi_._6_1_ = auVar10[6];
    local_f8.m_message.pn.pi_._7_1_ = auVar10[7];
    cStack_e0 = auVar10[8];
    cStack_df = auVar10[9];
    cStack_de = auVar10[10];
    cStack_dd = auVar10[0xb];
    cStack_dc = auVar10[0xc];
    cStack_db = auVar10[0xd];
    cStack_da = auVar10[0xe];
    cStack_d9 = auVar10[0xf];
    auVar10[0] = -((char)pbVar5->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar10[1] = -(*(char *)((long)pbVar5->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar10[2] = -(*(char *)((long)pbVar5->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar10[3] = -(*(char *)((long)pbVar5->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar10[4] = -((char)pbVar5->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar10[5] = -(*(char *)((long)pbVar5->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar10[6] = -(*(char *)((long)pbVar5->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar10[7] = -(*(char *)((long)pbVar5->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar10[8] = -((char)local_f8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar10[9] = -(local_f8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar10[10] = -(local_f8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar10[0xb] = -(local_f8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar10[0xc] = -(local_f8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar10[0xd] = -(local_f8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar10[0xe] = -(local_f8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar10[0xf] = -(local_f8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar33[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_f8.m_message.pn.pi_);
    auVar33[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_f8.m_message.pn.pi_._1_1_);
    auVar33[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_f8.m_message.pn.pi_._2_1_);
    auVar33[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_f8.m_message.pn.pi_._3_1_);
    auVar33[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_f8.m_message.pn.pi_._4_1_);
    auVar33[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_f8.m_message.pn.pi_._5_1_);
    auVar33[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_f8.m_message.pn.pi_._6_1_);
    auVar33[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_f8.m_message.pn.pi_._7_1_);
    auVar33[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_e0);
    auVar33[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_df);
    auVar33[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_de);
    auVar33[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_dd);
    auVar33[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_dc);
    auVar33[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_db);
    auVar33[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_da);
    auVar33[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_d9);
    auVar10 = auVar10 & auVar33;
    local_118 = (char *)CONCAT71(local_118._1_7_,
                                 (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar10[0xf] >> 7) << 0xf) == 0xffff);
    sStack_110.px = (element_type *)0x0;
    sStack_110.pn.pi_ = (sp_counted_base *)0x0;
    local_390._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (OneL << i)";
    local_390.m_message.px = (element_type *)0xe85612;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_390;
    local_148 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_140 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)local_58,1,0,WARN,_cVar38,
               (size_t)&local_148,0xa7);
    boost::detail::shared_count::~shared_count(&sStack_110.pn);
    if ((void *)local_d8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_c8[0] - local_d8._0_8_);
    }
    local_98._8_8_ = uRam00000000013ea784;
    local_98._0_8_ = OneL;
    local_88._8_4_ = (uint32_t)uRam00000000013ea794;
    local_88._12_4_ = uRam00000000013ea794._4_4_;
    local_88._0_8_ = _DAT_013ea78c;
    base_uint<256U>::operator<<=((base_uint<256U> *)local_98,uVar7);
    local_158 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_150 = "";
    local_168 = &boost::unit_test::basic_cstring<char_const>::null;
    local_160 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0xa9;
    file_00.m_begin = (iterator)&local_158;
    msg_00.m_end = pvVar9;
    msg_00.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_168,
               msg_00);
    paStack_40 = (assertion_result *)uRam00000000013ea794;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013ea78c;
    auStack_50._0_8_ = uRam00000000013ea784;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    auVar24[0] = -((char)pbVar5->pn[4] == local_88[0]);
    auVar24[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_88[1]);
    auVar24[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_88[2]);
    auVar24[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_88[3]);
    auVar24[4] = -((char)pbVar5->pn[5] == local_88[4]);
    auVar24[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_88[5]);
    auVar24[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_88[6]);
    auVar24[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_88[7]);
    auVar24[8] = -((char)pbVar5->pn[6] == local_88[8]);
    auVar24[9] = -(*(char *)((long)pbVar5->pn + 0x19) == local_88[9]);
    auVar24[10] = -(*(char *)((long)pbVar5->pn + 0x1a) == local_88[10]);
    auVar24[0xb] = -(*(char *)((long)pbVar5->pn + 0x1b) == local_88[0xb]);
    auVar24[0xc] = -((char)pbVar5->pn[7] == local_88[0xc]);
    auVar24[0xd] = -(*(char *)((long)pbVar5->pn + 0x1d) == local_88[0xd]);
    auVar24[0xe] = -(*(char *)((long)pbVar5->pn + 0x1e) == local_88[0xe]);
    auVar24[0xf] = -(*(char *)((long)pbVar5->pn + 0x1f) == local_88[0xf]);
    auVar11[0] = -((char)pbVar5->pn[0] == local_98[0]);
    auVar11[1] = -(*(char *)((long)pbVar5->pn + 1) == local_98[1]);
    auVar11[2] = -(*(char *)((long)pbVar5->pn + 2) == local_98[2]);
    auVar11[3] = -(*(char *)((long)pbVar5->pn + 3) == local_98[3]);
    auVar11[4] = -((char)pbVar5->pn[1] == local_98[4]);
    auVar11[5] = -(*(char *)((long)pbVar5->pn + 5) == local_98[5]);
    auVar11[6] = -(*(char *)((long)pbVar5->pn + 6) == local_98[6]);
    auVar11[7] = -(*(char *)((long)pbVar5->pn + 7) == local_98[7]);
    auVar11[8] = -((char)pbVar5->pn[2] == local_98[8]);
    auVar11[9] = -(*(char *)((long)pbVar5->pn + 9) == local_98[9]);
    auVar11[10] = -(*(char *)((long)pbVar5->pn + 10) == local_98[10]);
    auVar11[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_98[0xb]);
    auVar11[0xc] = -((char)pbVar5->pn[3] == local_98[0xc]);
    auVar11[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_98[0xd]);
    auVar11[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_98[0xe]);
    auVar11[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_98[0xf]);
    auVar11 = auVar11 & auVar24;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar11 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar11 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar11 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar11 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar11 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar11 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar11 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar11 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar11 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar11 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar11 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar11 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar11 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar11 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar11[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px._0_1_ = 0;
    local_f8.m_message.px._1_1_ = 0;
    local_f8.m_message.px._2_1_ = 0;
    local_f8.m_message.px._3_1_ = 0;
    local_f8.m_message.px._4_1_ = 0;
    local_f8.m_message.px._5_1_ = 0;
    local_f8.m_message.px._6_1_ = 0;
    local_f8.m_message.px._7_1_ = 0;
    local_f8.m_message.pn.pi_._0_1_ = 0;
    local_f8.m_message.pn.pi_._1_1_ = 0;
    local_f8.m_message.pn.pi_._2_1_ = 0;
    local_f8.m_message.pn.pi_._3_1_ = 0;
    local_f8.m_message.pn.pi_._4_1_ = 0;
    local_f8.m_message.pn.pi_._5_1_ = 0;
    local_f8.m_message.pn.pi_._6_1_ = 0;
    local_f8.m_message.pn.pi_._7_1_ = 0;
    local_118 = "TmpL == (OneL << i)";
    sStack_110.px = (element_type *)0xe85626;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_178 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_170 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    paStack_40 = (assertion_result *)&local_118;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_178,0xa9);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    local_188 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_180 = "";
    local_198 = &boost::unit_test::basic_cstring<char_const>::null;
    local_190 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0xaa;
    file_01.m_begin = (iterator)&local_188;
    msg_01.m_end = pvVar9;
    msg_01.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_198,
               msg_01);
    paStack_40 = (assertion_result *)uRam00000000013ea7d4;
    local_58 = (undefined1  [8])_HalfL;
    auStack_50._8_8_ = _DAT_013ea7cc;
    auStack_50._0_8_ = uRam00000000013ea7c4;
    pbVar5 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar4);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    paStack_40 = (assertion_result *)uRam00000000013ea794;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013ea78c;
    auStack_50._0_8_ = uRam00000000013ea784;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
    local_f8.m_message.px._0_1_ = (char)pbVar5->pn[2];
    local_f8.m_message.px._1_1_ = *(char *)((long)pbVar5->pn + 9);
    local_f8.m_message.px._2_1_ = *(char *)((long)pbVar5->pn + 10);
    local_f8.m_message.px._3_1_ = *(char *)((long)pbVar5->pn + 0xb);
    local_f8.m_message.px._4_1_ = (char)pbVar5->pn[3];
    local_f8.m_message.px._5_1_ = *(char *)((long)pbVar5->pn + 0xd);
    local_f8.m_message.px._6_1_ = *(char *)((long)pbVar5->pn + 0xe);
    local_f8.m_message.px._7_1_ = *(char *)((long)pbVar5->pn + 0xf);
    local_f8.m_message.pn.pi_._0_1_ = (char)pbVar5->pn[4];
    local_f8.m_message.pn.pi_._1_1_ = *(char *)((long)pbVar5->pn + 0x11);
    local_f8.m_message.pn.pi_._2_1_ = *(char *)((long)pbVar5->pn + 0x12);
    local_f8.m_message.pn.pi_._3_1_ = *(char *)((long)pbVar5->pn + 0x13);
    local_f8.m_message.pn.pi_._4_1_ = (char)pbVar5->pn[5];
    local_f8.m_message.pn.pi_._5_1_ = *(char *)((long)pbVar5->pn + 0x15);
    local_f8.m_message.pn.pi_._6_1_ = *(char *)((long)pbVar5->pn + 0x16);
    local_f8.m_message.pn.pi_._7_1_ = *(char *)((long)pbVar5->pn + 0x17);
    cStack_e0 = (char)pbVar5->pn[6];
    cStack_df = *(char *)((long)pbVar5->pn + 0x19);
    cStack_de = *(char *)((long)pbVar5->pn + 0x1a);
    cStack_dd = *(char *)((long)pbVar5->pn + 0x1b);
    cStack_dc = (char)pbVar5->pn[7];
    cStack_db = *(char *)((long)pbVar5->pn + 0x1d);
    cStack_da = *(char *)((long)pbVar5->pn + 0x1e);
    cStack_d9 = *(char *)((long)pbVar5->pn + 0x1f);
    auVar25[0] = -((char)local_f8.m_message.pn.pi_ == (char)local_b8.super_base_uint<256U>.pn[4]);
    auVar25[1] = -(local_f8.m_message.pn.pi_._1_1_ == local_b8.super_base_uint<256U>.pn[4]._1_1_);
    auVar25[2] = -(local_f8.m_message.pn.pi_._2_1_ == local_b8.super_base_uint<256U>.pn[4]._2_1_);
    auVar25[3] = -(local_f8.m_message.pn.pi_._3_1_ == local_b8.super_base_uint<256U>.pn[4]._3_1_);
    auVar25[4] = -(local_f8.m_message.pn.pi_._4_1_ == (char)local_b8.super_base_uint<256U>.pn[5]);
    auVar25[5] = -(local_f8.m_message.pn.pi_._5_1_ == local_b8.super_base_uint<256U>.pn[5]._1_1_);
    auVar25[6] = -(local_f8.m_message.pn.pi_._6_1_ == local_b8.super_base_uint<256U>.pn[5]._2_1_);
    auVar25[7] = -(local_f8.m_message.pn.pi_._7_1_ == local_b8.super_base_uint<256U>.pn[5]._3_1_);
    auVar25[8] = -(cStack_e0 == (char)local_b8.super_base_uint<256U>.pn[6]);
    auVar25[9] = -(cStack_df == local_b8.super_base_uint<256U>.pn[6]._1_1_);
    auVar25[10] = -(cStack_de == local_b8.super_base_uint<256U>.pn[6]._2_1_);
    auVar25[0xb] = -(cStack_dd == local_b8.super_base_uint<256U>.pn[6]._3_1_);
    auVar25[0xc] = -(cStack_dc == (char)local_b8.super_base_uint<256U>.pn[7]);
    auVar25[0xd] = -(cStack_db == local_b8.super_base_uint<256U>.pn[7]._1_1_);
    auVar25[0xe] = -(cStack_da == local_b8.super_base_uint<256U>.pn[7]._2_1_);
    auVar25[0xf] = -(cStack_d9 == local_b8.super_base_uint<256U>.pn[7]._3_1_);
    auVar12[0] = -((char)pbVar5->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar12[1] = -(*(char *)((long)pbVar5->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar12[2] = -(*(char *)((long)pbVar5->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar12[3] = -(*(char *)((long)pbVar5->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar12[4] = -((char)pbVar5->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar12[5] = -(*(char *)((long)pbVar5->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar12[6] = -(*(char *)((long)pbVar5->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar12[7] = -(*(char *)((long)pbVar5->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar12[8] = -((char)local_f8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar12[9] = -(local_f8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar12[10] = -(local_f8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar12[0xb] = -(local_f8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar12[0xc] = -(local_f8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar12[0xd] = -(local_f8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar12[0xe] = -(local_f8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar12[0xf] = -(local_f8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar12 = auVar12 & auVar25;
    local_118 = (char *)CONCAT71(local_118._1_7_,
                                 (ushort)((ushort)(SUB161(auVar12 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar12 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar12 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar12 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar12 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar12 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar12 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar12 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar12 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar12 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar12 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar12 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar12 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar12 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar12 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar12[0xf] >> 7) << 0xf) == 0xffff);
    sStack_110.px = (element_type *)0x0;
    sStack_110.pn.pi_ = (sp_counted_base *)0x0;
    local_d8._8_8_ = "";
    local_d8._0_8_ = "(HalfL >> (255-i)) == (OneL << i)";
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)local_d8;
    local_1a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1a0 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)local_58,1,0,WARN,_cVar38,
               (size_t)&local_1a8,0xaa);
    boost::detail::shared_count::~shared_count(&sStack_110.pn);
    local_98._8_8_ = uRam00000000013ea7c4;
    local_98._0_8_ = _HalfL;
    local_88._8_4_ = (uint32_t)uRam00000000013ea7d4;
    local_88._12_4_ = uRam00000000013ea7d4._4_4_;
    local_88._0_8_ = _DAT_013ea7cc;
    base_uint<256U>::operator>>=((base_uint<256U> *)local_98,uVar4);
    local_1b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1b0 = "";
    local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0xac;
    file_02.m_begin = (iterator)&local_1b8;
    msg_02.m_end = pvVar9;
    msg_02.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1c8,
               msg_02);
    paStack_40 = (assertion_result *)uRam00000000013ea794;
    local_58 = (undefined1  [8])OneL;
    auStack_50._8_8_ = _DAT_013ea78c;
    auStack_50._0_8_ = uRam00000000013ea784;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    auVar26[0] = -((char)pbVar5->pn[4] == local_88[0]);
    auVar26[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_88[1]);
    auVar26[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_88[2]);
    auVar26[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_88[3]);
    auVar26[4] = -((char)pbVar5->pn[5] == local_88[4]);
    auVar26[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_88[5]);
    auVar26[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_88[6]);
    auVar26[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_88[7]);
    auVar26[8] = -((char)pbVar5->pn[6] == local_88[8]);
    auVar26[9] = -(*(char *)((long)pbVar5->pn + 0x19) == local_88[9]);
    auVar26[10] = -(*(char *)((long)pbVar5->pn + 0x1a) == local_88[10]);
    auVar26[0xb] = -(*(char *)((long)pbVar5->pn + 0x1b) == local_88[0xb]);
    auVar26[0xc] = -((char)pbVar5->pn[7] == local_88[0xc]);
    auVar26[0xd] = -(*(char *)((long)pbVar5->pn + 0x1d) == local_88[0xd]);
    auVar26[0xe] = -(*(char *)((long)pbVar5->pn + 0x1e) == local_88[0xe]);
    auVar26[0xf] = -(*(char *)((long)pbVar5->pn + 0x1f) == local_88[0xf]);
    auVar13[0] = -((char)pbVar5->pn[0] == local_98[0]);
    auVar13[1] = -(*(char *)((long)pbVar5->pn + 1) == local_98[1]);
    auVar13[2] = -(*(char *)((long)pbVar5->pn + 2) == local_98[2]);
    auVar13[3] = -(*(char *)((long)pbVar5->pn + 3) == local_98[3]);
    auVar13[4] = -((char)pbVar5->pn[1] == local_98[4]);
    auVar13[5] = -(*(char *)((long)pbVar5->pn + 5) == local_98[5]);
    auVar13[6] = -(*(char *)((long)pbVar5->pn + 6) == local_98[6]);
    auVar13[7] = -(*(char *)((long)pbVar5->pn + 7) == local_98[7]);
    auVar13[8] = -((char)pbVar5->pn[2] == local_98[8]);
    auVar13[9] = -(*(char *)((long)pbVar5->pn + 9) == local_98[9]);
    auVar13[10] = -(*(char *)((long)pbVar5->pn + 10) == local_98[10]);
    auVar13[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_98[0xb]);
    auVar13[0xc] = -((char)pbVar5->pn[3] == local_98[0xc]);
    auVar13[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_98[0xd]);
    auVar13[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_98[0xe]);
    auVar13[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_98[0xf]);
    auVar13 = auVar13 & auVar26;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar13 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar13 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar13 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar13 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar13 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar13 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar13 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar13 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar13 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar13 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar13 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar13 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar13 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar13 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar13 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar13[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px._0_1_ = '\0';
    local_f8.m_message.px._1_1_ = '\0';
    local_f8.m_message.px._2_1_ = '\0';
    local_f8.m_message.px._3_1_ = '\0';
    local_f8.m_message.px._4_1_ = '\0';
    local_f8.m_message.px._5_1_ = '\0';
    local_f8.m_message.px._6_1_ = '\0';
    local_f8.m_message.px._7_1_ = '\0';
    local_f8.m_message.pn.pi_._0_1_ = '\0';
    local_f8.m_message.pn.pi_._1_1_ = '\0';
    local_f8.m_message.pn.pi_._2_1_ = '\0';
    local_f8.m_message.pn.pi_._3_1_ = '\0';
    local_f8.m_message.pn.pi_._4_1_ = '\0';
    local_f8.m_message.pn.pi_._5_1_ = '\0';
    local_f8.m_message.pn.pi_._6_1_ = '\0';
    local_f8.m_message.pn.pi_._7_1_ = '\0';
    local_118 = "TmpL == (OneL << i)";
    sStack_110.px = (element_type *)0xe85626;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_1d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1d0 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    uVar6 = 0xac;
    paStack_40 = (assertion_result *)&local_118;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_1d8,0xac);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    shiftArrayLeft(local_78,R1Array,uVar7,uVar6);
    local_1e8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_1e0 = "";
    local_1f8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1f0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0xaf;
    file_03.m_begin = (iterator)&local_1e8;
    msg_03.m_end = pvVar9;
    msg_03.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1f8,
               msg_03);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_78,local_58,
               (allocator_type *)&local_3a0);
    if (local_d8._8_8_ - local_d8._0_8_ != 0x20) break;
    memmove((lazy_ostream *)local_58,(void *)local_d8._0_8_,0x20);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013ea734;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013ea72c;
    auStack_50._0_8_ = uRam00000000013ea724;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
    local_f8.m_message.px._0_1_ = (char)pbVar5->pn[2];
    local_f8.m_message.px._1_1_ = *(char *)((long)pbVar5->pn + 9);
    local_f8.m_message.px._2_1_ = *(char *)((long)pbVar5->pn + 10);
    local_f8.m_message.px._3_1_ = *(char *)((long)pbVar5->pn + 0xb);
    local_f8.m_message.px._4_1_ = (char)pbVar5->pn[3];
    local_f8.m_message.px._5_1_ = *(char *)((long)pbVar5->pn + 0xd);
    local_f8.m_message.px._6_1_ = *(char *)((long)pbVar5->pn + 0xe);
    local_f8.m_message.px._7_1_ = *(char *)((long)pbVar5->pn + 0xf);
    auVar10 = *(undefined1 (*) [16])(pbVar5->pn + 4);
    local_f8.m_message.pn.pi_._0_1_ = auVar10[0];
    local_f8.m_message.pn.pi_._1_1_ = auVar10[1];
    local_f8.m_message.pn.pi_._2_1_ = auVar10[2];
    local_f8.m_message.pn.pi_._3_1_ = auVar10[3];
    local_f8.m_message.pn.pi_._4_1_ = auVar10[4];
    local_f8.m_message.pn.pi_._5_1_ = auVar10[5];
    local_f8.m_message.pn.pi_._6_1_ = auVar10[6];
    local_f8.m_message.pn.pi_._7_1_ = auVar10[7];
    cStack_e0 = auVar10[8];
    cStack_df = auVar10[9];
    cStack_de = auVar10[10];
    cStack_dd = auVar10[0xb];
    cStack_dc = auVar10[0xc];
    cStack_db = auVar10[0xd];
    cStack_da = auVar10[0xe];
    cStack_d9 = auVar10[0xf];
    auVar14[0] = -((char)pbVar5->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar14[1] = -(*(char *)((long)pbVar5->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar14[2] = -(*(char *)((long)pbVar5->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar14[3] = -(*(char *)((long)pbVar5->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar14[4] = -((char)pbVar5->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar14[5] = -(*(char *)((long)pbVar5->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar14[6] = -(*(char *)((long)pbVar5->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar14[7] = -(*(char *)((long)pbVar5->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar14[8] = -((char)local_f8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar14[9] = -(local_f8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar14[10] = -(local_f8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar14[0xb] = -(local_f8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar14[0xc] = -(local_f8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar14[0xd] = -(local_f8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar14[0xe] = -(local_f8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar14[0xf] = -(local_f8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar34[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_f8.m_message.pn.pi_);
    auVar34[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_f8.m_message.pn.pi_._1_1_);
    auVar34[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_f8.m_message.pn.pi_._2_1_);
    auVar34[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_f8.m_message.pn.pi_._3_1_);
    auVar34[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_f8.m_message.pn.pi_._4_1_);
    auVar34[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_f8.m_message.pn.pi_._5_1_);
    auVar34[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_f8.m_message.pn.pi_._6_1_);
    auVar34[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_f8.m_message.pn.pi_._7_1_);
    auVar34[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_e0);
    auVar34[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_df);
    auVar34[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_de);
    auVar34[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_dd);
    auVar34[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_dc);
    auVar34[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_db);
    auVar34[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_da);
    auVar34[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_d9);
    auVar14 = auVar14 & auVar34;
    local_118 = (char *)CONCAT71(local_118._1_7_,
                                 (ushort)((ushort)(SUB161(auVar14 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar14 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar14 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar14 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar14 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar14 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar14 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar14 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar14 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar14 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar14 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar14 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar14 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar14 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar14 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar14[0xf] >> 7) << 0xf) == 0xffff);
    sStack_110.px = (element_type *)0x0;
    sStack_110.pn.pi_ = (sp_counted_base *)0x0;
    local_390._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L << i)";
    local_390.m_message.px = (element_type *)0xe85697;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_390;
    local_208 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_200 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)local_58,1,0,WARN,_cVar38,
               (size_t)&local_208,0xaf);
    boost::detail::shared_count::~shared_count(&sStack_110.pn);
    if ((void *)local_d8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_c8[0] - local_d8._0_8_);
    }
    local_98._8_8_ = uRam00000000013ea724;
    local_98._0_8_ = R1L;
    local_88._8_4_ = (uint32_t)uRam00000000013ea734;
    local_88._12_4_ = uRam00000000013ea734._4_4_;
    local_88._0_8_ = _DAT_013ea72c;
    base_uint<256U>::operator<<=((base_uint<256U> *)local_98,uVar7);
    local_218 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_210 = "";
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    local_220 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0xb1;
    file_04.m_begin = (iterator)&local_218;
    msg_04.m_end = pvVar9;
    msg_04.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_228,
               msg_04);
    paStack_40 = (assertion_result *)uRam00000000013ea734;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013ea72c;
    auStack_50._0_8_ = uRam00000000013ea724;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    auVar27[0] = -((char)pbVar5->pn[4] == local_88[0]);
    auVar27[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_88[1]);
    auVar27[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_88[2]);
    auVar27[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_88[3]);
    auVar27[4] = -((char)pbVar5->pn[5] == local_88[4]);
    auVar27[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_88[5]);
    auVar27[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_88[6]);
    auVar27[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_88[7]);
    auVar27[8] = -((char)pbVar5->pn[6] == local_88[8]);
    auVar27[9] = -(*(char *)((long)pbVar5->pn + 0x19) == local_88[9]);
    auVar27[10] = -(*(char *)((long)pbVar5->pn + 0x1a) == local_88[10]);
    auVar27[0xb] = -(*(char *)((long)pbVar5->pn + 0x1b) == local_88[0xb]);
    auVar27[0xc] = -((char)pbVar5->pn[7] == local_88[0xc]);
    auVar27[0xd] = -(*(char *)((long)pbVar5->pn + 0x1d) == local_88[0xd]);
    auVar27[0xe] = -(*(char *)((long)pbVar5->pn + 0x1e) == local_88[0xe]);
    auVar27[0xf] = -(*(char *)((long)pbVar5->pn + 0x1f) == local_88[0xf]);
    auVar15[0] = -((char)pbVar5->pn[0] == local_98[0]);
    auVar15[1] = -(*(char *)((long)pbVar5->pn + 1) == local_98[1]);
    auVar15[2] = -(*(char *)((long)pbVar5->pn + 2) == local_98[2]);
    auVar15[3] = -(*(char *)((long)pbVar5->pn + 3) == local_98[3]);
    auVar15[4] = -((char)pbVar5->pn[1] == local_98[4]);
    auVar15[5] = -(*(char *)((long)pbVar5->pn + 5) == local_98[5]);
    auVar15[6] = -(*(char *)((long)pbVar5->pn + 6) == local_98[6]);
    auVar15[7] = -(*(char *)((long)pbVar5->pn + 7) == local_98[7]);
    auVar15[8] = -((char)pbVar5->pn[2] == local_98[8]);
    auVar15[9] = -(*(char *)((long)pbVar5->pn + 9) == local_98[9]);
    auVar15[10] = -(*(char *)((long)pbVar5->pn + 10) == local_98[10]);
    auVar15[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_98[0xb]);
    auVar15[0xc] = -((char)pbVar5->pn[3] == local_98[0xc]);
    auVar15[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_98[0xd]);
    auVar15[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_98[0xe]);
    auVar15[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_98[0xf]);
    auVar15 = auVar15 & auVar27;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px._0_1_ = '\0';
    local_f8.m_message.px._1_1_ = '\0';
    local_f8.m_message.px._2_1_ = '\0';
    local_f8.m_message.px._3_1_ = '\0';
    local_f8.m_message.px._4_1_ = '\0';
    local_f8.m_message.px._5_1_ = '\0';
    local_f8.m_message.px._6_1_ = '\0';
    local_f8.m_message.px._7_1_ = '\0';
    local_f8.m_message.pn.pi_._0_1_ = '\0';
    local_f8.m_message.pn.pi_._1_1_ = '\0';
    local_f8.m_message.pn.pi_._2_1_ = '\0';
    local_f8.m_message.pn.pi_._3_1_ = '\0';
    local_f8.m_message.pn.pi_._4_1_ = '\0';
    local_f8.m_message.pn.pi_._5_1_ = '\0';
    local_f8.m_message.pn.pi_._6_1_ = '\0';
    local_f8.m_message.pn.pi_._7_1_ = '\0';
    local_118 = "TmpL == (R1L << i)";
    sStack_110.px = (element_type *)0xe856aa;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_118;
    local_238 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_230 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    uVar6 = 0xb1;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_238,0xb1);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    shiftArrayRight(local_78,R1Array,uVar7,uVar6);
    local_248 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_240 = "";
    local_258 = &boost::unit_test::basic_cstring<char_const>::null;
    local_250 = &boost::unit_test::basic_cstring<char_const>::null;
    file_05.m_end = (iterator)0xb4;
    file_05.m_begin = (iterator)&local_248;
    msg_05.m_end = pvVar9;
    msg_05.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_258,
               msg_05);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_78,local_58,
               (allocator_type *)&local_3a0);
    if (local_d8._8_8_ - local_d8._0_8_ != 0x20) break;
    memmove((lazy_ostream *)local_58,(void *)local_d8._0_8_,0x20);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013ea734;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013ea72c;
    auStack_50._0_8_ = uRam00000000013ea724;
    pbVar5 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar7);
    local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
    local_f8.m_message.px._0_1_ = (char)pbVar5->pn[2];
    local_f8.m_message.px._1_1_ = *(char *)((long)pbVar5->pn + 9);
    local_f8.m_message.px._2_1_ = *(char *)((long)pbVar5->pn + 10);
    local_f8.m_message.px._3_1_ = *(char *)((long)pbVar5->pn + 0xb);
    local_f8.m_message.px._4_1_ = (char)pbVar5->pn[3];
    local_f8.m_message.px._5_1_ = *(char *)((long)pbVar5->pn + 0xd);
    local_f8.m_message.px._6_1_ = *(char *)((long)pbVar5->pn + 0xe);
    local_f8.m_message.px._7_1_ = *(char *)((long)pbVar5->pn + 0xf);
    auVar10 = *(undefined1 (*) [16])(pbVar5->pn + 4);
    local_f8.m_message.pn.pi_._0_1_ = auVar10[0];
    local_f8.m_message.pn.pi_._1_1_ = auVar10[1];
    local_f8.m_message.pn.pi_._2_1_ = auVar10[2];
    local_f8.m_message.pn.pi_._3_1_ = auVar10[3];
    local_f8.m_message.pn.pi_._4_1_ = auVar10[4];
    local_f8.m_message.pn.pi_._5_1_ = auVar10[5];
    local_f8.m_message.pn.pi_._6_1_ = auVar10[6];
    local_f8.m_message.pn.pi_._7_1_ = auVar10[7];
    cStack_e0 = auVar10[8];
    cStack_df = auVar10[9];
    cStack_de = auVar10[10];
    cStack_dd = auVar10[0xb];
    cStack_dc = auVar10[0xc];
    cStack_db = auVar10[0xd];
    cStack_da = auVar10[0xe];
    cStack_d9 = auVar10[0xf];
    auVar16[0] = -((char)pbVar5->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar16[1] = -(*(char *)((long)pbVar5->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar16[2] = -(*(char *)((long)pbVar5->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar16[3] = -(*(char *)((long)pbVar5->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar16[4] = -((char)pbVar5->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar16[5] = -(*(char *)((long)pbVar5->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar16[6] = -(*(char *)((long)pbVar5->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar16[7] = -(*(char *)((long)pbVar5->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar16[8] = -((char)local_f8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar16[9] = -(local_f8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar16[10] = -(local_f8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar16[0xb] = -(local_f8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar16[0xc] = -(local_f8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar16[0xd] = -(local_f8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar16[0xe] = -(local_f8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar16[0xf] = -(local_f8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar35[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_f8.m_message.pn.pi_);
    auVar35[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_f8.m_message.pn.pi_._1_1_);
    auVar35[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_f8.m_message.pn.pi_._2_1_);
    auVar35[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_f8.m_message.pn.pi_._3_1_);
    auVar35[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_f8.m_message.pn.pi_._4_1_);
    auVar35[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_f8.m_message.pn.pi_._5_1_);
    auVar35[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_f8.m_message.pn.pi_._6_1_);
    auVar35[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_f8.m_message.pn.pi_._7_1_);
    auVar35[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_e0);
    auVar35[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_df);
    auVar35[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_de);
    auVar35[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_dd);
    auVar35[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_dc);
    auVar35[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_db);
    auVar35[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_da);
    auVar35[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_d9);
    auVar16 = auVar16 & auVar35;
    local_118 = (char *)CONCAT71(local_118._1_7_,
                                 (ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) == 0xffff);
    sStack_110.px = (element_type *)0x0;
    sStack_110.pn.pi_ = (sp_counted_base *)0x0;
    local_390._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L >> i)";
    local_390.m_message.px = (element_type *)0xe856f9;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_390;
    local_268 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_260 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)local_58,1,0,WARN,_cVar38,
               (size_t)&local_268,0xb4);
    boost::detail::shared_count::~shared_count(&sStack_110.pn);
    if ((void *)local_d8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_c8[0] - local_d8._0_8_);
    }
    local_98._8_8_ = uRam00000000013ea724;
    local_98._0_8_ = R1L;
    local_88._8_4_ = (uint32_t)uRam00000000013ea734;
    local_88._12_4_ = uRam00000000013ea734._4_4_;
    local_88._0_8_ = _DAT_013ea72c;
    base_uint<256U>::operator>>=((base_uint<256U> *)local_98,uVar7);
    local_278 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_270 = "";
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_280 = &boost::unit_test::basic_cstring<char_const>::null;
    file_06.m_end = (iterator)0xb6;
    file_06.m_begin = (iterator)&local_278;
    msg_06.m_end = pvVar9;
    msg_06.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_288,
               msg_06);
    paStack_40 = (assertion_result *)uRam00000000013ea734;
    local_58 = (undefined1  [8])R1L;
    auStack_50._8_8_ = _DAT_013ea72c;
    auStack_50._0_8_ = uRam00000000013ea724;
    pbVar5 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar7);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    auVar28[0] = -((char)pbVar5->pn[4] == local_88[0]);
    auVar28[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_88[1]);
    auVar28[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_88[2]);
    auVar28[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_88[3]);
    auVar28[4] = -((char)pbVar5->pn[5] == local_88[4]);
    auVar28[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_88[5]);
    auVar28[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_88[6]);
    auVar28[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_88[7]);
    auVar28[8] = -((char)pbVar5->pn[6] == local_88[8]);
    auVar28[9] = -(*(char *)((long)pbVar5->pn + 0x19) == local_88[9]);
    auVar28[10] = -(*(char *)((long)pbVar5->pn + 0x1a) == local_88[10]);
    auVar28[0xb] = -(*(char *)((long)pbVar5->pn + 0x1b) == local_88[0xb]);
    auVar28[0xc] = -((char)pbVar5->pn[7] == local_88[0xc]);
    auVar28[0xd] = -(*(char *)((long)pbVar5->pn + 0x1d) == local_88[0xd]);
    auVar28[0xe] = -(*(char *)((long)pbVar5->pn + 0x1e) == local_88[0xe]);
    auVar28[0xf] = -(*(char *)((long)pbVar5->pn + 0x1f) == local_88[0xf]);
    auVar17[0] = -((char)pbVar5->pn[0] == local_98[0]);
    auVar17[1] = -(*(char *)((long)pbVar5->pn + 1) == local_98[1]);
    auVar17[2] = -(*(char *)((long)pbVar5->pn + 2) == local_98[2]);
    auVar17[3] = -(*(char *)((long)pbVar5->pn + 3) == local_98[3]);
    auVar17[4] = -((char)pbVar5->pn[1] == local_98[4]);
    auVar17[5] = -(*(char *)((long)pbVar5->pn + 5) == local_98[5]);
    auVar17[6] = -(*(char *)((long)pbVar5->pn + 6) == local_98[6]);
    auVar17[7] = -(*(char *)((long)pbVar5->pn + 7) == local_98[7]);
    auVar17[8] = -((char)pbVar5->pn[2] == local_98[8]);
    auVar17[9] = -(*(char *)((long)pbVar5->pn + 9) == local_98[9]);
    auVar17[10] = -(*(char *)((long)pbVar5->pn + 10) == local_98[10]);
    auVar17[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_98[0xb]);
    auVar17[0xc] = -((char)pbVar5->pn[3] == local_98[0xc]);
    auVar17[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_98[0xd]);
    auVar17[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_98[0xe]);
    auVar17[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_98[0xf]);
    auVar17 = auVar17 & auVar28;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px._0_1_ = '\0';
    local_f8.m_message.px._1_1_ = '\0';
    local_f8.m_message.px._2_1_ = '\0';
    local_f8.m_message.px._3_1_ = '\0';
    local_f8.m_message.px._4_1_ = '\0';
    local_f8.m_message.px._5_1_ = '\0';
    local_f8.m_message.px._6_1_ = '\0';
    local_f8.m_message.px._7_1_ = '\0';
    local_f8.m_message.pn.pi_._0_1_ = '\0';
    local_f8.m_message.pn.pi_._1_1_ = '\0';
    local_f8.m_message.pn.pi_._2_1_ = '\0';
    local_f8.m_message.pn.pi_._3_1_ = '\0';
    local_f8.m_message.pn.pi_._4_1_ = '\0';
    local_f8.m_message.pn.pi_._5_1_ = '\0';
    local_f8.m_message.pn.pi_._6_1_ = '\0';
    local_f8.m_message.pn.pi_._7_1_ = '\0';
    local_118 = "TmpL == (R1L >> i)";
    sStack_110.px = (element_type *)0xe8570c;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_118;
    local_298 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_290 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    uVar6 = 0xb6;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_298,0xb6);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    shiftArrayLeft(local_78,MaxArray,uVar7,uVar6);
    local_2a8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2a0 = "";
    local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_07.m_end = (iterator)0xb9;
    file_07.m_begin = (iterator)&local_2a8;
    msg_07.m_end = pvVar9;
    msg_07.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_2b8,
               msg_07);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_78,local_58,
               (allocator_type *)&local_3a0);
    if (local_d8._8_8_ - local_d8._0_8_ != 0x20) break;
    memmove((lazy_ostream *)local_58,(void *)local_d8._0_8_,0x20);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013ea7b4;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013ea7ac;
    auStack_50._0_8_ = uRam00000000013ea7a4;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
    local_f8.m_message.px._0_1_ = (char)pbVar5->pn[2];
    local_f8.m_message.px._1_1_ = *(char *)((long)pbVar5->pn + 9);
    local_f8.m_message.px._2_1_ = *(char *)((long)pbVar5->pn + 10);
    local_f8.m_message.px._3_1_ = *(char *)((long)pbVar5->pn + 0xb);
    local_f8.m_message.px._4_1_ = (char)pbVar5->pn[3];
    local_f8.m_message.px._5_1_ = *(char *)((long)pbVar5->pn + 0xd);
    local_f8.m_message.px._6_1_ = *(char *)((long)pbVar5->pn + 0xe);
    local_f8.m_message.px._7_1_ = *(char *)((long)pbVar5->pn + 0xf);
    auVar10 = *(undefined1 (*) [16])(pbVar5->pn + 4);
    local_f8.m_message.pn.pi_._0_1_ = auVar10[0];
    local_f8.m_message.pn.pi_._1_1_ = auVar10[1];
    local_f8.m_message.pn.pi_._2_1_ = auVar10[2];
    local_f8.m_message.pn.pi_._3_1_ = auVar10[3];
    local_f8.m_message.pn.pi_._4_1_ = auVar10[4];
    local_f8.m_message.pn.pi_._5_1_ = auVar10[5];
    local_f8.m_message.pn.pi_._6_1_ = auVar10[6];
    local_f8.m_message.pn.pi_._7_1_ = auVar10[7];
    cStack_e0 = auVar10[8];
    cStack_df = auVar10[9];
    cStack_de = auVar10[10];
    cStack_dd = auVar10[0xb];
    cStack_dc = auVar10[0xc];
    cStack_db = auVar10[0xd];
    cStack_da = auVar10[0xe];
    cStack_d9 = auVar10[0xf];
    auVar18[0] = -((char)pbVar5->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar18[1] = -(*(char *)((long)pbVar5->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar18[2] = -(*(char *)((long)pbVar5->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar18[3] = -(*(char *)((long)pbVar5->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar18[4] = -((char)pbVar5->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar18[5] = -(*(char *)((long)pbVar5->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar18[6] = -(*(char *)((long)pbVar5->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar18[7] = -(*(char *)((long)pbVar5->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar18[8] = -((char)local_f8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar18[9] = -(local_f8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar18[10] = -(local_f8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar18[0xb] = -(local_f8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar18[0xc] = -(local_f8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar18[0xd] = -(local_f8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar18[0xe] = -(local_f8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar18[0xf] = -(local_f8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar36[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_f8.m_message.pn.pi_);
    auVar36[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_f8.m_message.pn.pi_._1_1_);
    auVar36[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_f8.m_message.pn.pi_._2_1_);
    auVar36[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_f8.m_message.pn.pi_._3_1_);
    auVar36[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_f8.m_message.pn.pi_._4_1_);
    auVar36[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_f8.m_message.pn.pi_._5_1_);
    auVar36[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_f8.m_message.pn.pi_._6_1_);
    auVar36[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_f8.m_message.pn.pi_._7_1_);
    auVar36[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_e0);
    auVar36[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_df);
    auVar36[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_de);
    auVar36[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_dd);
    auVar36[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_dc);
    auVar36[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_db);
    auVar36[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_da);
    auVar36[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_d9);
    auVar18 = auVar18 & auVar36;
    local_118 = (char *)CONCAT71(local_118._1_7_,
                                 (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff);
    sStack_110.px = (element_type *)0x0;
    sStack_110.pn.pi_ = (sp_counted_base *)0x0;
    local_390._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL << i)";
    local_390.m_message.px = (element_type *)0xe8575c;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_390;
    local_2c8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2c0 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)local_58,1,0,WARN,_cVar38,
               (size_t)&local_2c8,0xb9);
    boost::detail::shared_count::~shared_count(&sStack_110.pn);
    if ((void *)local_d8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_c8[0] - local_d8._0_8_);
    }
    local_98._8_8_ = uRam00000000013ea7a4;
    local_98._0_8_ = _MaxL;
    local_88._8_4_ = (uint32_t)uRam00000000013ea7b4;
    local_88._12_4_ = uRam00000000013ea7b4._4_4_;
    local_88._0_8_ = _DAT_013ea7ac;
    base_uint<256U>::operator<<=((base_uint<256U> *)local_98,uVar7);
    local_2d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2d0 = "";
    local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0xbb;
    file_08.m_begin = (iterator)&local_2d8;
    msg_08.m_end = pvVar9;
    msg_08.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2e8,
               msg_08);
    paStack_40 = (assertion_result *)uRam00000000013ea7b4;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013ea7ac;
    auStack_50._0_8_ = uRam00000000013ea7a4;
    pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    auVar29[0] = -((char)pbVar5->pn[4] == local_88[0]);
    auVar29[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_88[1]);
    auVar29[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_88[2]);
    auVar29[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_88[3]);
    auVar29[4] = -((char)pbVar5->pn[5] == local_88[4]);
    auVar29[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_88[5]);
    auVar29[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_88[6]);
    auVar29[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_88[7]);
    auVar29[8] = -((char)pbVar5->pn[6] == local_88[8]);
    auVar29[9] = -(*(char *)((long)pbVar5->pn + 0x19) == local_88[9]);
    auVar29[10] = -(*(char *)((long)pbVar5->pn + 0x1a) == local_88[10]);
    auVar29[0xb] = -(*(char *)((long)pbVar5->pn + 0x1b) == local_88[0xb]);
    auVar29[0xc] = -((char)pbVar5->pn[7] == local_88[0xc]);
    auVar29[0xd] = -(*(char *)((long)pbVar5->pn + 0x1d) == local_88[0xd]);
    auVar29[0xe] = -(*(char *)((long)pbVar5->pn + 0x1e) == local_88[0xe]);
    auVar29[0xf] = -(*(char *)((long)pbVar5->pn + 0x1f) == local_88[0xf]);
    auVar19[0] = -((char)pbVar5->pn[0] == local_98[0]);
    auVar19[1] = -(*(char *)((long)pbVar5->pn + 1) == local_98[1]);
    auVar19[2] = -(*(char *)((long)pbVar5->pn + 2) == local_98[2]);
    auVar19[3] = -(*(char *)((long)pbVar5->pn + 3) == local_98[3]);
    auVar19[4] = -((char)pbVar5->pn[1] == local_98[4]);
    auVar19[5] = -(*(char *)((long)pbVar5->pn + 5) == local_98[5]);
    auVar19[6] = -(*(char *)((long)pbVar5->pn + 6) == local_98[6]);
    auVar19[7] = -(*(char *)((long)pbVar5->pn + 7) == local_98[7]);
    auVar19[8] = -((char)pbVar5->pn[2] == local_98[8]);
    auVar19[9] = -(*(char *)((long)pbVar5->pn + 9) == local_98[9]);
    auVar19[10] = -(*(char *)((long)pbVar5->pn + 10) == local_98[10]);
    auVar19[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_98[0xb]);
    auVar19[0xc] = -((char)pbVar5->pn[3] == local_98[0xc]);
    auVar19[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_98[0xd]);
    auVar19[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_98[0xe]);
    auVar19[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_98[0xf]);
    auVar19 = auVar19 & auVar29;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar19[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px._0_1_ = '\0';
    local_f8.m_message.px._1_1_ = '\0';
    local_f8.m_message.px._2_1_ = '\0';
    local_f8.m_message.px._3_1_ = '\0';
    local_f8.m_message.px._4_1_ = '\0';
    local_f8.m_message.px._5_1_ = '\0';
    local_f8.m_message.px._6_1_ = '\0';
    local_f8.m_message.px._7_1_ = '\0';
    local_f8.m_message.pn.pi_._0_1_ = '\0';
    local_f8.m_message.pn.pi_._1_1_ = '\0';
    local_f8.m_message.pn.pi_._2_1_ = '\0';
    local_f8.m_message.pn.pi_._3_1_ = '\0';
    local_f8.m_message.pn.pi_._4_1_ = '\0';
    local_f8.m_message.pn.pi_._5_1_ = '\0';
    local_f8.m_message.pn.pi_._6_1_ = '\0';
    local_f8.m_message.pn.pi_._7_1_ = '\0';
    local_118 = "TmpL == (MaxL << i)";
    sStack_110.px = (element_type *)0xe85770;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = (assertion_result *)&local_118;
    local_2f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_2f0 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    uVar6 = 0xbb;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_2f8,0xbb);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    shiftArrayRight(local_78,MaxArray,uVar7,uVar6);
    local_308 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_300 = "";
    local_318 = &boost::unit_test::basic_cstring<char_const>::null;
    local_310 = &boost::unit_test::basic_cstring<char_const>::null;
    file_09.m_end = (iterator)0xbe;
    file_09.m_begin = (iterator)&local_308;
    msg_09.m_end = pvVar9;
    msg_09.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_318,
               msg_09);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)local_d8,local_78,local_58,
               (allocator_type *)&local_3a0);
    if (local_d8._8_8_ - local_d8._0_8_ != 0x20) break;
    memmove((lazy_ostream *)local_58,(void *)local_d8._0_8_,0x20);
    UintToArith256(&local_b8,(uint256 *)local_58);
    paStack_40 = (assertion_result *)uRam00000000013ea7b4;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013ea7ac;
    auStack_50._0_8_ = uRam00000000013ea7a4;
    pbVar5 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar7);
    local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
    local_f8.m_message.px._0_1_ = (char)pbVar5->pn[2];
    local_f8.m_message.px._1_1_ = *(char *)((long)pbVar5->pn + 9);
    local_f8.m_message.px._2_1_ = *(char *)((long)pbVar5->pn + 10);
    local_f8.m_message.px._3_1_ = *(char *)((long)pbVar5->pn + 0xb);
    local_f8.m_message.px._4_1_ = (char)pbVar5->pn[3];
    local_f8.m_message.px._5_1_ = *(char *)((long)pbVar5->pn + 0xd);
    local_f8.m_message.px._6_1_ = *(char *)((long)pbVar5->pn + 0xe);
    local_f8.m_message.px._7_1_ = *(char *)((long)pbVar5->pn + 0xf);
    auVar10 = *(undefined1 (*) [16])(pbVar5->pn + 4);
    local_f8.m_message.pn.pi_._0_1_ = auVar10[0];
    local_f8.m_message.pn.pi_._1_1_ = auVar10[1];
    local_f8.m_message.pn.pi_._2_1_ = auVar10[2];
    local_f8.m_message.pn.pi_._3_1_ = auVar10[3];
    local_f8.m_message.pn.pi_._4_1_ = auVar10[4];
    local_f8.m_message.pn.pi_._5_1_ = auVar10[5];
    local_f8.m_message.pn.pi_._6_1_ = auVar10[6];
    local_f8.m_message.pn.pi_._7_1_ = auVar10[7];
    cStack_e0 = auVar10[8];
    cStack_df = auVar10[9];
    cStack_de = auVar10[10];
    cStack_dd = auVar10[0xb];
    cStack_dc = auVar10[0xc];
    cStack_db = auVar10[0xd];
    cStack_da = auVar10[0xe];
    cStack_d9 = auVar10[0xf];
    auVar20[0] = -((char)pbVar5->pn[0] == (char)local_b8.super_base_uint<256U>.pn[0]);
    auVar20[1] = -(*(char *)((long)pbVar5->pn + 1) == local_b8.super_base_uint<256U>.pn[0]._1_1_);
    auVar20[2] = -(*(char *)((long)pbVar5->pn + 2) == local_b8.super_base_uint<256U>.pn[0]._2_1_);
    auVar20[3] = -(*(char *)((long)pbVar5->pn + 3) == local_b8.super_base_uint<256U>.pn[0]._3_1_);
    auVar20[4] = -((char)pbVar5->pn[1] == (char)local_b8.super_base_uint<256U>.pn[1]);
    auVar20[5] = -(*(char *)((long)pbVar5->pn + 5) == local_b8.super_base_uint<256U>.pn[1]._1_1_);
    auVar20[6] = -(*(char *)((long)pbVar5->pn + 6) == local_b8.super_base_uint<256U>.pn[1]._2_1_);
    auVar20[7] = -(*(char *)((long)pbVar5->pn + 7) == local_b8.super_base_uint<256U>.pn[1]._3_1_);
    auVar20[8] = -((char)local_f8.m_message.px == (char)local_b8.super_base_uint<256U>.pn[2]);
    auVar20[9] = -(local_f8.m_message.px._1_1_ == local_b8.super_base_uint<256U>.pn[2]._1_1_);
    auVar20[10] = -(local_f8.m_message.px._2_1_ == local_b8.super_base_uint<256U>.pn[2]._2_1_);
    auVar20[0xb] = -(local_f8.m_message.px._3_1_ == local_b8.super_base_uint<256U>.pn[2]._3_1_);
    auVar20[0xc] = -(local_f8.m_message.px._4_1_ == (char)local_b8.super_base_uint<256U>.pn[3]);
    auVar20[0xd] = -(local_f8.m_message.px._5_1_ == local_b8.super_base_uint<256U>.pn[3]._1_1_);
    auVar20[0xe] = -(local_f8.m_message.px._6_1_ == local_b8.super_base_uint<256U>.pn[3]._2_1_);
    auVar20[0xf] = -(local_f8.m_message.px._7_1_ == local_b8.super_base_uint<256U>.pn[3]._3_1_);
    auVar37[0] = -((char)local_b8.super_base_uint<256U>.pn[4] == (char)local_f8.m_message.pn.pi_);
    auVar37[1] = -(local_b8.super_base_uint<256U>.pn[4]._1_1_ == local_f8.m_message.pn.pi_._1_1_);
    auVar37[2] = -(local_b8.super_base_uint<256U>.pn[4]._2_1_ == local_f8.m_message.pn.pi_._2_1_);
    auVar37[3] = -(local_b8.super_base_uint<256U>.pn[4]._3_1_ == local_f8.m_message.pn.pi_._3_1_);
    auVar37[4] = -((char)local_b8.super_base_uint<256U>.pn[5] == local_f8.m_message.pn.pi_._4_1_);
    auVar37[5] = -(local_b8.super_base_uint<256U>.pn[5]._1_1_ == local_f8.m_message.pn.pi_._5_1_);
    auVar37[6] = -(local_b8.super_base_uint<256U>.pn[5]._2_1_ == local_f8.m_message.pn.pi_._6_1_);
    auVar37[7] = -(local_b8.super_base_uint<256U>.pn[5]._3_1_ == local_f8.m_message.pn.pi_._7_1_);
    auVar37[8] = -((char)local_b8.super_base_uint<256U>.pn[6] == cStack_e0);
    auVar37[9] = -(local_b8.super_base_uint<256U>.pn[6]._1_1_ == cStack_df);
    auVar37[10] = -(local_b8.super_base_uint<256U>.pn[6]._2_1_ == cStack_de);
    auVar37[0xb] = -(local_b8.super_base_uint<256U>.pn[6]._3_1_ == cStack_dd);
    auVar37[0xc] = -((char)local_b8.super_base_uint<256U>.pn[7] == cStack_dc);
    auVar37[0xd] = -(local_b8.super_base_uint<256U>.pn[7]._1_1_ == cStack_db);
    auVar37[0xe] = -(local_b8.super_base_uint<256U>.pn[7]._2_1_ == cStack_da);
    auVar37[0xf] = -(local_b8.super_base_uint<256U>.pn[7]._3_1_ == cStack_d9);
    auVar20 = auVar20 & auVar37;
    local_118 = (char *)CONCAT71(local_118._1_7_,
                                 (ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                          (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                          (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                          (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                          (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                          (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                          (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                          (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                          (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                          (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                          (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                          (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                          (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                          (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                          (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe |
                                         (ushort)(byte)(auVar20[0xf] >> 7) << 0xf) == 0xffff);
    sStack_110.px = (element_type *)0x0;
    sStack_110.pn.pi_ = (sp_counted_base *)0x0;
    local_390._0_8_ =
         "arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL >> i)";
    local_390.m_message.px = (element_type *)0xe857c0;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    paStack_40 = &local_390;
    local_328 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_320 = "";
    pvVar8 = (iterator)0x1;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_118,(lazy_ostream *)local_58,1,0,WARN,_cVar38,
               (size_t)&local_328,0xbe);
    boost::detail::shared_count::~shared_count(&sStack_110.pn);
    if ((void *)local_d8._0_8_ != (void *)0x0) {
      operator_delete((void *)local_d8._0_8_,local_c8[0] - local_d8._0_8_);
    }
    local_98._8_8_ = uRam00000000013ea7a4;
    local_98._0_8_ = _MaxL;
    local_88._8_4_ = (uint32_t)uRam00000000013ea7b4;
    local_88._12_4_ = uRam00000000013ea7b4._4_4_;
    local_88._0_8_ = _DAT_013ea7ac;
    base_uint<256U>::operator>>=((base_uint<256U> *)local_98,uVar7);
    local_338 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_330 = "";
    local_348 = &boost::unit_test::basic_cstring<char_const>::null;
    local_340 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = &DAT_000000c0;
    file_10.m_begin = (iterator)&local_338;
    msg_10.m_end = pvVar9;
    msg_10.m_begin = pvVar8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_348,
               msg_10);
    paStack_40 = (assertion_result *)uRam00000000013ea7b4;
    local_58 = (undefined1  [8])_MaxL;
    auStack_50._8_8_ = _DAT_013ea7ac;
    auStack_50._0_8_ = uRam00000000013ea7a4;
    pbVar5 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar7);
    local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
    local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
    local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
    local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
    auVar30[0] = -((char)pbVar5->pn[4] == local_88[0]);
    auVar30[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_88[1]);
    auVar30[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_88[2]);
    auVar30[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_88[3]);
    auVar30[4] = -((char)pbVar5->pn[5] == local_88[4]);
    auVar30[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_88[5]);
    auVar30[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_88[6]);
    auVar30[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_88[7]);
    auVar30[8] = -((char)pbVar5->pn[6] == local_88[8]);
    auVar30[9] = -(*(char *)((long)pbVar5->pn + 0x19) == local_88[9]);
    auVar30[10] = -(*(char *)((long)pbVar5->pn + 0x1a) == local_88[10]);
    auVar30[0xb] = -(*(char *)((long)pbVar5->pn + 0x1b) == local_88[0xb]);
    auVar30[0xc] = -((char)pbVar5->pn[7] == local_88[0xc]);
    auVar30[0xd] = -(*(char *)((long)pbVar5->pn + 0x1d) == local_88[0xd]);
    auVar30[0xe] = -(*(char *)((long)pbVar5->pn + 0x1e) == local_88[0xe]);
    auVar30[0xf] = -(*(char *)((long)pbVar5->pn + 0x1f) == local_88[0xf]);
    auVar21[0] = -((char)pbVar5->pn[0] == local_98[0]);
    auVar21[1] = -(*(char *)((long)pbVar5->pn + 1) == local_98[1]);
    auVar21[2] = -(*(char *)((long)pbVar5->pn + 2) == local_98[2]);
    auVar21[3] = -(*(char *)((long)pbVar5->pn + 3) == local_98[3]);
    auVar21[4] = -((char)pbVar5->pn[1] == local_98[4]);
    auVar21[5] = -(*(char *)((long)pbVar5->pn + 5) == local_98[5]);
    auVar21[6] = -(*(char *)((long)pbVar5->pn + 6) == local_98[6]);
    auVar21[7] = -(*(char *)((long)pbVar5->pn + 7) == local_98[7]);
    auVar21[8] = -((char)pbVar5->pn[2] == local_98[8]);
    auVar21[9] = -(*(char *)((long)pbVar5->pn + 9) == local_98[9]);
    auVar21[10] = -(*(char *)((long)pbVar5->pn + 10) == local_98[10]);
    auVar21[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_98[0xb]);
    auVar21[0xc] = -((char)pbVar5->pn[3] == local_98[0xc]);
    auVar21[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_98[0xd]);
    auVar21[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_98[0xe]);
    auVar21[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_98[0xf]);
    auVar21 = auVar21 & auVar30;
    local_f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         (readonly_property<bool>)
         ((ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                   (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                   (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                   (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                   (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                   (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                   (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                   (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                   (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                   (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                   (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                   (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                   (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                   (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                   (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                  (ushort)(byte)(auVar21[0xf] >> 7) << 0xf) == 0xffff);
    local_f8.m_message.px._0_1_ = '\0';
    local_f8.m_message.px._1_1_ = '\0';
    local_f8.m_message.px._2_1_ = '\0';
    local_f8.m_message.px._3_1_ = '\0';
    local_f8.m_message.px._4_1_ = '\0';
    local_f8.m_message.px._5_1_ = '\0';
    local_f8.m_message.px._6_1_ = '\0';
    local_f8.m_message.px._7_1_ = '\0';
    local_f8.m_message.pn.pi_._0_1_ = '\0';
    local_f8.m_message.pn.pi_._1_1_ = '\0';
    local_f8.m_message.pn.pi_._2_1_ = '\0';
    local_f8.m_message.pn.pi_._3_1_ = '\0';
    local_f8.m_message.pn.pi_._4_1_ = '\0';
    local_f8.m_message.pn.pi_._5_1_ = '\0';
    local_f8.m_message.pn.pi_._6_1_ = '\0';
    local_f8.m_message.pn.pi_._7_1_ = '\0';
    local_118 = "TmpL == (MaxL >> i)";
    sStack_110.px = (element_type *)0xe863eb;
    auStack_50._0_8_ = auStack_50._1_8_ << 8;
    local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
    auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
    local_358 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
    ;
    local_350 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    in_RCX = 0xc0;
    paStack_40 = (assertion_result *)&local_118;
    boost::test_tools::tt_detail::report_assertion
              (&local_f8,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_358,0xc0);
    boost::detail::shared_count::~shared_count(&local_f8.m_message.pn);
    uVar7 = uVar7 + 1;
    uVar4 = uVar4 - 1;
    if (uVar7 == 0x100) {
      local_d8 = (undefined1  [16])0x0;
      local_c8[0]._0_4_ = 0;
      local_c8[0]._4_4_ = 0;
      local_58 = (undefined1  [8])0x123456789abcdef;
      auStack_50 = (undefined1  [16])0x0;
      paStack_40 = (assertion_result *)0x0;
      uVar4 = 0x80;
      pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,0x80);
      local_b8.super_base_uint<256U>.pn._0_8_ = *(undefined8 *)pbVar5->pn;
      local_b8.super_base_uint<256U>.pn._8_8_ = *(undefined8 *)(pbVar5->pn + 2);
      local_b8.super_base_uint<256U>.pn._16_8_ = *(undefined8 *)(pbVar5->pn + 4);
      local_b8.super_base_uint<256U>.pn._24_8_ = *(undefined8 *)(pbVar5->pn + 6);
      uVar7 = 0;
      do {
        local_368 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_360 = "";
        local_378 = &boost::unit_test::basic_cstring<char_const>::null;
        local_370 = &boost::unit_test::basic_cstring<char_const>::null;
        file_11.m_end = (iterator)0xc5;
        file_11.m_begin = (iterator)&local_368;
        msg_11.m_end = in_R9;
        msg_11.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_378
                   ,msg_11);
        local_58 = (undefined1  [8])0x123456789abcdef;
        paStack_40 = (assertion_result *)0x0;
        auStack_50 = (undefined1  [16])0x0;
        pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar7);
        local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
        uVar1 = *(undefined8 *)(pbVar5->pn + 2);
        uVar2 = *(undefined8 *)(pbVar5->pn + 4);
        uVar3 = *(undefined8 *)(pbVar5->pn + 6);
        local_f8.m_message.px._0_1_ = (char)uVar1;
        local_f8.m_message.px._1_1_ = (char)((ulong)uVar1 >> 8);
        local_f8.m_message.px._2_1_ = (char)((ulong)uVar1 >> 0x10);
        local_f8.m_message.px._3_1_ = (char)((ulong)uVar1 >> 0x18);
        local_f8.m_message.px._4_1_ = (char)((ulong)uVar1 >> 0x20);
        local_f8.m_message.px._5_1_ = (char)((ulong)uVar1 >> 0x28);
        local_f8.m_message.px._6_1_ = (char)((ulong)uVar1 >> 0x30);
        local_f8.m_message.px._7_1_ = (char)((ulong)uVar1 >> 0x38);
        local_f8.m_message.pn.pi_._0_1_ = (char)uVar2;
        local_f8.m_message.pn.pi_._1_1_ = (char)((ulong)uVar2 >> 8);
        local_f8.m_message.pn.pi_._2_1_ = (char)((ulong)uVar2 >> 0x10);
        local_f8.m_message.pn.pi_._3_1_ = (char)((ulong)uVar2 >> 0x18);
        local_f8.m_message.pn.pi_._4_1_ = (char)((ulong)uVar2 >> 0x20);
        local_f8.m_message.pn.pi_._5_1_ = (char)((ulong)uVar2 >> 0x28);
        local_f8.m_message.pn.pi_._6_1_ = (char)((ulong)uVar2 >> 0x30);
        local_f8.m_message.pn.pi_._7_1_ = (char)((ulong)uVar2 >> 0x38);
        cStack_e0 = (char)uVar3;
        cStack_df = (char)((ulong)uVar3 >> 8);
        cStack_de = (char)((ulong)uVar3 >> 0x10);
        cStack_dd = (char)((ulong)uVar3 >> 0x18);
        cStack_dc = (char)((ulong)uVar3 >> 0x20);
        cStack_db = (char)((ulong)uVar3 >> 0x28);
        cStack_da = (char)((ulong)uVar3 >> 0x30);
        cStack_d9 = (char)((ulong)uVar3 >> 0x38);
        paStack_40 = (assertion_result *)local_b8.super_base_uint<256U>.pn._24_8_;
        local_58._0_4_ = local_b8.super_base_uint<256U>.pn[0];
        local_58._4_4_ = local_b8.super_base_uint<256U>.pn[1];
        auStack_50._8_4_ = local_b8.super_base_uint<256U>.pn[4];
        auStack_50._12_4_ = local_b8.super_base_uint<256U>.pn[5];
        auStack_50._0_4_ = local_b8.super_base_uint<256U>.pn[2];
        auStack_50._4_4_ = local_b8.super_base_uint<256U>.pn[3];
        pbVar5 = base_uint<256U>::operator>>=((base_uint<256U> *)local_58,uVar4);
        local_118 = *(char **)pbVar5->pn;
        sStack_110 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(pbVar5->pn + 2);
        cStack_100 = (char)pbVar5->pn[6];
        cStack_ff = *(char *)((long)pbVar5->pn + 0x19);
        cStack_fe = *(char *)((long)pbVar5->pn + 0x1a);
        cStack_fd = *(char *)((long)pbVar5->pn + 0x1b);
        cStack_fc = (char)pbVar5->pn[7];
        cStack_fb = *(char *)((long)pbVar5->pn + 0x1d);
        cStack_fa = *(char *)((long)pbVar5->pn + 0x1e);
        cStack_f9 = *(char *)((long)pbVar5->pn + 0x1f);
        auVar31[0] = -((char)pbVar5->pn[4] == (char)local_f8.m_message.pn.pi_);
        auVar31[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_f8.m_message.pn.pi_._1_1_);
        auVar31[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_f8.m_message.pn.pi_._2_1_);
        auVar31[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_f8.m_message.pn.pi_._3_1_);
        auVar31[4] = -((char)pbVar5->pn[5] == local_f8.m_message.pn.pi_._4_1_);
        auVar31[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_f8.m_message.pn.pi_._5_1_);
        auVar31[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_f8.m_message.pn.pi_._6_1_);
        auVar31[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_f8.m_message.pn.pi_._7_1_);
        auVar31[8] = -(cStack_100 == cStack_e0);
        auVar31[9] = -(cStack_ff == cStack_df);
        auVar31[10] = -(cStack_fe == cStack_de);
        auVar31[0xb] = -(cStack_fd == cStack_dd);
        auVar31[0xc] = -(cStack_fc == cStack_dc);
        auVar31[0xd] = -(cStack_fb == cStack_db);
        auVar31[0xe] = -(cStack_fa == cStack_da);
        auVar31[0xf] = -(cStack_f9 == cStack_d9);
        auVar22[0] = -((class_property<bool>)*(class_property<bool> *)pbVar5->pn ==
                      local_f8.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value);
        auVar22[1] = -(*(char *)((long)pbVar5->pn + 1) == local_f8._1_1_);
        auVar22[2] = -(*(char *)((long)pbVar5->pn + 2) == local_f8._2_1_);
        auVar22[3] = -(*(char *)((long)pbVar5->pn + 3) == local_f8._3_1_);
        auVar22[4] = -((char)pbVar5->pn[1] == local_f8._4_1_);
        auVar22[5] = -(*(char *)((long)pbVar5->pn + 5) == local_f8._5_1_);
        auVar22[6] = -(*(char *)((long)pbVar5->pn + 6) == local_f8._6_1_);
        auVar22[7] = -(*(char *)((long)pbVar5->pn + 7) == local_f8._7_1_);
        auVar22[8] = -(*(char *)&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                                 (pbVar5->pn + 2))->px == (char)local_f8.m_message.px);
        auVar22[9] = -(*(char *)((long)pbVar5->pn + 9) == local_f8.m_message.px._1_1_);
        auVar22[10] = -(*(char *)((long)pbVar5->pn + 10) == local_f8.m_message.px._2_1_);
        auVar22[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_f8.m_message.px._3_1_);
        auVar22[0xc] = -((char)pbVar5->pn[3] == local_f8.m_message.px._4_1_);
        auVar22[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_f8.m_message.px._5_1_);
        auVar22[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_f8.m_message.px._6_1_);
        auVar22[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_f8.m_message.px._7_1_);
        auVar22 = auVar22 & auVar31;
        local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar22[0xf] >> 7) << 0xf) == 0xffff);
        local_390.m_message.px = (element_type *)0x0;
        local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_3a0 = "(c1L << i) == (c2L >> (128-i))";
        local_398 = "";
        auStack_50._0_8_ = auStack_50._1_8_ << 8;
        local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
        auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
        paStack_40 = (assertion_result *)&local_3a0;
        local_3b0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_3a8 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_390,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_3b0,0xc5);
        boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
        uVar7 = uVar7 + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
      uVar4 = 0x80;
      do {
        local_3c0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_3b8 = "";
        local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
        local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
        file_12.m_end = (iterator)0xc8;
        file_12.m_begin = (iterator)&local_3c0;
        msg_12.m_end = in_R9;
        msg_12.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3d0
                   ,msg_12);
        local_58 = (undefined1  [8])0x123456789abcdef;
        paStack_40 = (assertion_result *)local_c8[0];
        auStack_50 = local_d8;
        pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar4);
        local_f8._0_8_ = *(undefined8 *)pbVar5->pn;
        uVar1 = *(undefined8 *)(pbVar5->pn + 2);
        uVar2 = *(undefined8 *)(pbVar5->pn + 4);
        uVar3 = *(undefined8 *)(pbVar5->pn + 6);
        local_f8.m_message.px._0_1_ = (char)uVar1;
        local_f8.m_message.px._1_1_ = (char)((ulong)uVar1 >> 8);
        local_f8.m_message.px._2_1_ = (char)((ulong)uVar1 >> 0x10);
        local_f8.m_message.px._3_1_ = (char)((ulong)uVar1 >> 0x18);
        local_f8.m_message.px._4_1_ = (char)((ulong)uVar1 >> 0x20);
        local_f8.m_message.px._5_1_ = (char)((ulong)uVar1 >> 0x28);
        local_f8.m_message.px._6_1_ = (char)((ulong)uVar1 >> 0x30);
        local_f8.m_message.px._7_1_ = (char)((ulong)uVar1 >> 0x38);
        local_f8.m_message.pn.pi_._0_1_ = (char)uVar2;
        local_f8.m_message.pn.pi_._1_1_ = (char)((ulong)uVar2 >> 8);
        local_f8.m_message.pn.pi_._2_1_ = (char)((ulong)uVar2 >> 0x10);
        local_f8.m_message.pn.pi_._3_1_ = (char)((ulong)uVar2 >> 0x18);
        local_f8.m_message.pn.pi_._4_1_ = (char)((ulong)uVar2 >> 0x20);
        local_f8.m_message.pn.pi_._5_1_ = (char)((ulong)uVar2 >> 0x28);
        local_f8.m_message.pn.pi_._6_1_ = (char)((ulong)uVar2 >> 0x30);
        local_f8.m_message.pn.pi_._7_1_ = (char)((ulong)uVar2 >> 0x38);
        cStack_e0 = (char)uVar3;
        cStack_df = (char)((ulong)uVar3 >> 8);
        cStack_de = (char)((ulong)uVar3 >> 0x10);
        cStack_dd = (char)((ulong)uVar3 >> 0x18);
        cStack_dc = (char)((ulong)uVar3 >> 0x20);
        cStack_db = (char)((ulong)uVar3 >> 0x28);
        cStack_da = (char)((ulong)uVar3 >> 0x30);
        cStack_d9 = (char)((ulong)uVar3 >> 0x38);
        paStack_40 = (assertion_result *)local_b8.super_base_uint<256U>.pn._24_8_;
        local_58._0_4_ = local_b8.super_base_uint<256U>.pn[0];
        local_58._4_4_ = local_b8.super_base_uint<256U>.pn[1];
        auStack_50._8_4_ = local_b8.super_base_uint<256U>.pn[4];
        auStack_50._12_4_ = local_b8.super_base_uint<256U>.pn[5];
        auStack_50._0_4_ = local_b8.super_base_uint<256U>.pn[2];
        auStack_50._4_4_ = local_b8.super_base_uint<256U>.pn[3];
        pbVar5 = base_uint<256U>::operator<<=((base_uint<256U> *)local_58,uVar4 - 0x80);
        local_118 = *(char **)pbVar5->pn;
        sStack_110 = *(shared_ptr<boost::basic_wrap_stringstream<char>_> *)(pbVar5->pn + 2);
        cStack_100 = (char)pbVar5->pn[6];
        cStack_ff = *(char *)((long)pbVar5->pn + 0x19);
        cStack_fe = *(char *)((long)pbVar5->pn + 0x1a);
        cStack_fd = *(char *)((long)pbVar5->pn + 0x1b);
        cStack_fc = (char)pbVar5->pn[7];
        cStack_fb = *(char *)((long)pbVar5->pn + 0x1d);
        cStack_fa = *(char *)((long)pbVar5->pn + 0x1e);
        cStack_f9 = *(char *)((long)pbVar5->pn + 0x1f);
        auVar32[0] = -((char)pbVar5->pn[4] == (char)local_f8.m_message.pn.pi_);
        auVar32[1] = -(*(char *)((long)pbVar5->pn + 0x11) == local_f8.m_message.pn.pi_._1_1_);
        auVar32[2] = -(*(char *)((long)pbVar5->pn + 0x12) == local_f8.m_message.pn.pi_._2_1_);
        auVar32[3] = -(*(char *)((long)pbVar5->pn + 0x13) == local_f8.m_message.pn.pi_._3_1_);
        auVar32[4] = -((char)pbVar5->pn[5] == local_f8.m_message.pn.pi_._4_1_);
        auVar32[5] = -(*(char *)((long)pbVar5->pn + 0x15) == local_f8.m_message.pn.pi_._5_1_);
        auVar32[6] = -(*(char *)((long)pbVar5->pn + 0x16) == local_f8.m_message.pn.pi_._6_1_);
        auVar32[7] = -(*(char *)((long)pbVar5->pn + 0x17) == local_f8.m_message.pn.pi_._7_1_);
        auVar32[8] = -(cStack_100 == cStack_e0);
        auVar32[9] = -(cStack_ff == cStack_df);
        auVar32[10] = -(cStack_fe == cStack_de);
        auVar32[0xb] = -(cStack_fd == cStack_dd);
        auVar32[0xc] = -(cStack_fc == cStack_dc);
        auVar32[0xd] = -(cStack_fb == cStack_db);
        auVar32[0xe] = -(cStack_fa == cStack_da);
        auVar32[0xf] = -(cStack_f9 == cStack_d9);
        auVar23[0] = -((class_property<bool>)*(class_property<bool> *)pbVar5->pn ==
                      local_f8.p_predicate_value.super_readonly_property<bool>.
                      super_class_property<bool>.value);
        auVar23[1] = -(*(char *)((long)pbVar5->pn + 1) == local_f8._1_1_);
        auVar23[2] = -(*(char *)((long)pbVar5->pn + 2) == local_f8._2_1_);
        auVar23[3] = -(*(char *)((long)pbVar5->pn + 3) == local_f8._3_1_);
        auVar23[4] = -((char)pbVar5->pn[1] == local_f8._4_1_);
        auVar23[5] = -(*(char *)((long)pbVar5->pn + 5) == local_f8._5_1_);
        auVar23[6] = -(*(char *)((long)pbVar5->pn + 6) == local_f8._6_1_);
        auVar23[7] = -(*(char *)((long)pbVar5->pn + 7) == local_f8._7_1_);
        auVar23[8] = -(*(char *)&((shared_ptr<boost::basic_wrap_stringstream<char>_> *)
                                 (pbVar5->pn + 2))->px == (char)local_f8.m_message.px);
        auVar23[9] = -(*(char *)((long)pbVar5->pn + 9) == local_f8.m_message.px._1_1_);
        auVar23[10] = -(*(char *)((long)pbVar5->pn + 10) == local_f8.m_message.px._2_1_);
        auVar23[0xb] = -(*(char *)((long)pbVar5->pn + 0xb) == local_f8.m_message.px._3_1_);
        auVar23[0xc] = -((char)pbVar5->pn[3] == local_f8.m_message.px._4_1_);
        auVar23[0xd] = -(*(char *)((long)pbVar5->pn + 0xd) == local_f8.m_message.px._5_1_);
        auVar23[0xe] = -(*(char *)((long)pbVar5->pn + 0xe) == local_f8.m_message.px._6_1_);
        auVar23[0xf] = -(*(char *)((long)pbVar5->pn + 0xf) == local_f8.m_message.px._7_1_);
        auVar23 = auVar23 & auVar32;
        local_390.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)
             (readonly_property<bool>)
             ((ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar23[0xf] >> 7) << 0xf) == 0xffff);
        local_390.m_message.px = (element_type *)0x0;
        local_390.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_3a0 = "(c1L << i) == (c2L << (i-128))";
        local_398 = "";
        auStack_50._0_8_ = auStack_50._1_8_ << 8;
        local_58 = (undefined1  [8])&PTR__lazy_ostream_013d3df0;
        auStack_50._8_8_ = boost::unit_test::lazy_ostream::inst;
        paStack_40 = (assertion_result *)&local_3a0;
        local_3e0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/arith_uint256_tests.cpp"
        ;
        local_3d8 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_390,(lazy_ostream *)local_58,1,0,WARN,_cVar38,(size_t)&local_3e0,200);
        boost::detail::shared_count::~shared_count(&local_390.m_message.pn);
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x100);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  }
  __assert_fail("vch.size() == WIDTH",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/uint256.h"
                ,0x2a,"base_blob<256>::base_blob(Span<const unsigned char>) [BITS = 256]");
}

Assistant:

BOOST_AUTO_TEST_CASE( shifts ) { // "<<"  ">>"  "<<="  ">>="
    unsigned char TmpArray[32];
    arith_uint256 TmpL;
    for (unsigned int i = 0; i < 256; ++i)
    {
        shiftArrayLeft(TmpArray, OneArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (OneL << i));
        TmpL = OneL; TmpL <<= i;
        BOOST_CHECK(TmpL == (OneL << i));
        BOOST_CHECK((HalfL >> (255-i)) == (OneL << i));
        TmpL = HalfL; TmpL >>= (255-i);
        BOOST_CHECK(TmpL == (OneL << i));

        shiftArrayLeft(TmpArray, R1Array, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L << i));
        TmpL = R1L; TmpL <<= i;
        BOOST_CHECK(TmpL == (R1L << i));

        shiftArrayRight(TmpArray, R1Array, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (R1L >> i));
        TmpL = R1L; TmpL >>= i;
        BOOST_CHECK(TmpL == (R1L >> i));

        shiftArrayLeft(TmpArray, MaxArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL << i));
        TmpL = MaxL; TmpL <<= i;
        BOOST_CHECK(TmpL == (MaxL << i));

        shiftArrayRight(TmpArray, MaxArray, 32, i);
        BOOST_CHECK(arith_uint256V(std::vector<unsigned char>(TmpArray,TmpArray+32)) == (MaxL >> i));
        TmpL = MaxL; TmpL >>= i;
        BOOST_CHECK(TmpL == (MaxL >> i));
    }
    arith_uint256 c1L = arith_uint256(0x0123456789abcdefULL);
    arith_uint256 c2L = c1L << 128;
    for (unsigned int i = 0; i < 128; ++i) {
        BOOST_CHECK((c1L << i) == (c2L >> (128-i)));
    }
    for (unsigned int i = 128; i < 256; ++i) {
        BOOST_CHECK((c1L << i) == (c2L << (i-128)));
    }
}